

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::reallocate
          (ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this,size_t size)

{
  Ref *pRVar1;
  ulong local_28;
  size_t i;
  Ref *old;
  size_t size_local;
  ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this_local;
  
  pRVar1 = this->data;
  cashew::ArrayStorage::allocate((ArrayStorage *)this,size);
  for (local_28 = 0; local_28 < this->usedElements; local_28 = local_28 + 1) {
    this->data[local_28].inst = pRVar1[local_28].inst;
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }